

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_client.cc
# Opt level: O1

int __thiscall common::SSH2Client::RawMode(SSH2Client *this)

{
  int iVar1;
  termios local_54;
  
  iVar1 = fileno(_stdin);
  iVar1 = tcgetattr(iVar1,&local_54);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    *(ulong *)((this->saved_tio).c_cc + 0x1b) = CONCAT44(local_54._48_4_,local_54.c_cc._27_4_);
    (this->saved_tio).c_ispeed = local_54.c_ispeed;
    (this->saved_tio).c_ospeed = local_54.c_ospeed;
    *(undefined8 *)((this->saved_tio).c_cc + 0xf) = local_54.c_cc._15_8_;
    *(ulong *)((this->saved_tio).c_cc + 0x17) = CONCAT44(local_54.c_cc._27_4_,local_54.c_cc._23_4_);
    (this->saved_tio).c_line = local_54.c_line;
    (this->saved_tio).c_cc[0] = local_54.c_cc[0];
    (this->saved_tio).c_cc[1] = local_54.c_cc[1];
    (this->saved_tio).c_cc[2] = local_54.c_cc[2];
    (this->saved_tio).c_cc[3] = local_54.c_cc[3];
    (this->saved_tio).c_cc[4] = local_54.c_cc[4];
    (this->saved_tio).c_cc[5] = local_54.c_cc[5];
    (this->saved_tio).c_cc[6] = local_54.c_cc[6];
    *(undefined8 *)((this->saved_tio).c_cc + 7) = local_54.c_cc._7_8_;
    (this->saved_tio).c_iflag = local_54.c_iflag;
    (this->saved_tio).c_oflag = local_54.c_oflag;
    (this->saved_tio).c_cflag = local_54.c_cflag;
    (this->saved_tio).c_lflag = local_54.c_lflag;
    local_54.c_iflag = local_54.c_iflag & 0xfffffa14;
    local_54.c_oflag = local_54.c_oflag & 0xfffffffe;
    local_54.c_lflag = local_54.c_lflag & 0xffff7fb4;
    local_54.c_cflag = local_54.c_cflag & 0xfffffecf | 0x30;
    iVar1 = fileno(_stdin);
    iVar1 = tcsetattr(iVar1,1,&local_54);
  }
  return iVar1;
}

Assistant:

int SSH2Client::RawMode() {
    int rc;
    struct termios tio;

    rc = tcgetattr(fileno(stdin), &tio);
    if (rc != -1) {
        saved_tio = tio;
        /* do the equivalent of cfmakeraw() manually, to build on Solaris */
        tio.c_iflag &= ~(IGNBRK|BRKINT|PARMRK|ISTRIP|INLCR|IGNCR|ICRNL|IXON);
        tio.c_oflag &= ~OPOST;
        tio.c_lflag &= ~(ECHO|ECHONL|ICANON|ISIG|IEXTEN);
        tio.c_cflag &= ~(CSIZE|PARENB);
        tio.c_cflag |= CS8;
        rc = tcsetattr(fileno(stdin), TCSADRAIN, &tio);
    }
    return rc;
}